

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

void __thiscall cmServerStdIoConnection::cmServerStdIoConnection(cmServerStdIoConnection *this)

{
  cmServerBufferStrategy *this_00;
  cmServerStdIoConnection *this_local;
  
  this_00 = (cmServerBufferStrategy *)operator_new(0x28);
  cmServerBufferStrategy::cmServerBufferStrategy(this_00);
  cmStdIoConnection::cmStdIoConnection
            (&this->super_cmStdIoConnection,(cmConnectionBufferStrategy *)this_00);
  (this->super_cmStdIoConnection).super_cmEventBasedConnection.super_cmConnection._vptr_cmConnection
       = (_func_int **)&PTR_WriteData_00961440;
  return;
}

Assistant:

cmServerStdIoConnection::cmServerStdIoConnection()
  : cmStdIoConnection(new cmServerBufferStrategy)
{
}